

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void proto2_unittest::TestMutualRecursionA::SharedDtor(MessageLite *self)

{
  TestMutualRecursionB *this;
  TestMutualRecursionA_SubGroup *this_00;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  TestMutualRecursionA *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (TestMutualRecursionA *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar1 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    this = (TestMutualRecursionB *)local_18[3]._vptr_MessageLite;
    if (this != (TestMutualRecursionB *)0x0) {
      TestMutualRecursionB::~TestMutualRecursionB(this);
      operator_delete(this,0x28);
    }
    this_00 = (TestMutualRecursionA_SubGroup *)local_18[3]._internal_metadata_.ptr_;
    if (this_00 != (TestMutualRecursionA_SubGroup *)0x0) {
      TestMutualRecursionA_SubGroup::~TestMutualRecursionA_SubGroup(this_00);
      operator_delete(this_00,0x28);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
             ,0x5a48,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void TestMutualRecursionA::SharedDtor(MessageLite& self) {
  TestMutualRecursionA& this_ = static_cast<TestMutualRecursionA&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.bb_;
  delete this_._impl_.subgroup_;
  this_._impl_.~Impl_();
}